

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cc
# Opt level: O0

void __thiscall
rcg::GenTLException::GenTLException
          (GenTLException *this,string *msg,shared_ptr<const_rcg::GenTLWrapper> *gentl)

{
  element_type *peVar1;
  long lVar2;
  ostream *poVar3;
  string *in_RSI;
  exception *in_RDI;
  ostringstream out;
  size_t tmp_size;
  char tmp [1024];
  GC_ERROR err;
  string local_5d8 [32];
  ostringstream local_5b8 [392];
  size_t local_430;
  char local_428 [1036];
  int local_1c [3];
  string *local_10;
  
  local_10 = in_RSI;
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__GenTLException_0015ac40;
  std::__cxx11::string::string((string *)(in_RDI + 8));
  memset(local_428,0,0x400);
  local_430 = 0x400;
  peVar1 = std::
           __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x146bc0);
  (*peVar1->GCGetLastError)(local_1c,local_428,&local_430);
  std::__cxx11::ostringstream::ostringstream(local_5b8);
  lVar2 = std::__cxx11::string::size();
  if ((lVar2 == 0) || (local_1c[0] == 0)) {
    lVar2 = std::__cxx11::string::size();
    if (lVar2 == 0) {
      poVar3 = std::operator<<((ostream *)local_5b8,local_428);
      poVar3 = std::operator<<(poVar3," (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c[0]);
      std::operator<<(poVar3,")");
    }
    else {
      std::operator<<((ostream *)local_5b8,local_10);
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)local_5b8,local_10);
    poVar3 = std::operator<<(poVar3,": ");
    poVar3 = std::operator<<(poVar3,local_428);
    poVar3 = std::operator<<(poVar3," (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c[0]);
    std::operator<<(poVar3,")");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)(in_RDI + 8),local_5d8);
  std::__cxx11::string::~string(local_5d8);
  std::__cxx11::ostringstream::~ostringstream(local_5b8);
  return;
}

Assistant:

GenTLException::GenTLException(const std::string &msg,
                               const std::shared_ptr<const GenTLWrapper> &gentl)
{
  GenTL::GC_ERROR err;
  char tmp[1024]="";
  size_t tmp_size=sizeof(tmp);

  gentl->GCGetLastError(&err, tmp, &tmp_size);

  std::ostringstream out;

  if (msg.size() > 0 && err != GenTL::GC_ERR_SUCCESS)
  {
    out << msg << ": " << tmp << " (" << err << ")";
  }
  else if (msg.size() > 0)
  {
    out << msg;
  }
  else
  {
    out << tmp << " (" << err << ")";
  }

  s=out.str();
}